

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O0

FunctionJITTimeInfo * __thiscall
FunctionJITTimeInfo::GetInlinee(FunctionJITTimeInfo *this,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionJITTimeDataIDL *local_28;
  FunctionJITTimeInfo *inlinee;
  ProfileId profileId_local;
  FunctionJITTimeInfo *this_local;
  
  if (((this->m_data).bodyData)->profiledCallSiteCount <= profileId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x19e,"(profileId < m_data.bodyData->profiledCallSiteCount)",
                       "profileId < m_data.bodyData->profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->m_data).inlinees == (FunctionJITTimeDataIDL **)0x0) {
    this_local = (FunctionJITTimeInfo *)0x0;
  }
  else {
    if ((this->m_data).inlineeCount <= (uint)profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x1a3,"(profileId < m_data.inlineeCount)",
                         "profileId < m_data.inlineeCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_28 = (this->m_data).inlinees[profileId];
    if ((local_28 == (FunctionJITTimeDataIDL *)0x0) &&
       ((this->m_data).inlineesRecursionFlags[profileId] != '\0')) {
      local_28 = &this->m_data;
    }
    this_local = (FunctionJITTimeInfo *)local_28;
  }
  return this_local;
}

Assistant:

const FunctionJITTimeInfo *
FunctionJITTimeInfo::GetInlinee(Js::ProfileId profileId) const
{
    Assert(profileId < m_data.bodyData->profiledCallSiteCount);
    if (!m_data.inlinees)
    {
        return nullptr;
    }
    AssertOrFailFast(profileId < m_data.inlineeCount);

    auto inlinee = reinterpret_cast<const FunctionJITTimeInfo *>(m_data.inlinees[profileId]);
    if (inlinee == nullptr && m_data.inlineesRecursionFlags[profileId])
    {
        inlinee = this;
    }
    return inlinee;
}